

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O3

int XNVCTRLQueryTargetAttribute
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
              int *value)

{
  int iVar1;
  XExtDisplayInfo *info;
  undefined1 *puVar2;
  _func_int__XDisplay_ptr *p_Var3;
  xnvCtrlQueryAttributeReply rep;
  int local_58;
  int local_54;
  undefined1 local_50 [8];
  int local_48;
  int local_44;
  
  local_58 = target_id;
  local_54 = target_type;
  info = find_display(dpy);
  iVar1 = 0;
  if ((info != (XExtDisplayInfo *)0x0) && (iVar1 = 0, info->codes != (XExtCodes *)0x0)) {
    XNVCTRLCheckTargetData(dpy,info,&local_54,&local_58);
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->lock_display)(dpy);
    }
    puVar2 = (undefined1 *)_XGetRequest(dpy,2,0x10);
    *puVar2 = (char)info->codes->major_opcode;
    puVar2[1] = 2;
    *(undefined2 *)(puVar2 + 6) = (undefined2)local_54;
    *(undefined2 *)(puVar2 + 4) = (undefined2)local_58;
    *(uint *)(puVar2 + 8) = display_mask;
    *(uint *)(puVar2 + 0xc) = attribute;
    iVar1 = _XReply(dpy,local_50,0,1);
    if (iVar1 == 0) {
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      p_Var3 = dpy->synchandler;
      iVar1 = 0;
    }
    else {
      if (value != (int *)0x0) {
        *value = local_44;
      }
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      p_Var3 = dpy->synchandler;
      iVar1 = local_48;
    }
    if (p_Var3 != (_func_int__XDisplay_ptr *)0x0) {
      (*p_Var3)(dpy);
    }
  }
  return iVar1;
}

Assistant:

Bool XNVCTRLQueryTargetAttribute (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    int *value
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryAttributeReply rep;
    xnvCtrlQueryAttributeReq   *req;
    Bool exists;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlQueryAttribute, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryAttribute;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    if (!_XReply (dpy, (xReply *) &rep, 0, xTrue)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    if (value) *value = rep.value;
    exists = rep.flags;
    UnlockDisplay (dpy);
    SyncHandle ();
    return exists;
}